

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# counted_base.hpp
# Opt level: O3

void boost::xpressive::detail::
     counted_base_access<boost::xpressive::detail::results_extras<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
     ::release(counted_base<boost::xpressive::detail::results_extras<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *that)

{
  counted_base<boost::xpressive::detail::results_extras<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *pcVar1;
  long *plVar2;
  node *old_node;
  
  LOCK();
  (that->count_).value_ = (that->count_).value_ + -1;
  UNLOCK();
  if ((that->count_).value_ == 0) {
    if (that != (counted_base<boost::xpressive::detail::results_extras<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)0x0) {
      while (pcVar1 = *(counted_base<boost::xpressive::detail::results_extras<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        **)(that + 0xc), pcVar1 != that + 10) {
        plVar2 = *(long **)(pcVar1 + 2);
        *(long **)(that + 0xc) = plVar2;
        *plVar2 = (long)(that + 10);
        match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)(pcVar1 + 4));
        operator_delete(pcVar1);
      }
      sequence_stack<boost::xpressive::detail::sub_match_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::clear((sequence_stack<boost::xpressive::detail::sub_match_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)(that + 2));
    }
    operator_delete(that);
    return;
  }
  return;
}

Assistant:

counted_base &operator =(counted_base<Derived> const &)
        {
            return *this;
        }